

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void int_tif_to_float<int>
               (uint32_t width,uint32_t height,uint16_t spp,uint16_t config,TIFF *tif,
               vector<float,_std::allocator<float>_> *output_buffer)

{
  pointer pfVar1;
  undefined8 uVar2;
  long lVar3;
  runtime_error *this;
  uint uVar4;
  int iVar5;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint local_4c;
  
  uVar2 = TIFFScanlineSize(tif);
  lVar3 = _TIFFmalloc(uVar2);
  uVar8 = (uint)CONCAT62(in_register_00000012,spp);
  std::vector<float,_std::allocator<float>_>::resize(output_buffer,(ulong)(height * width * uVar8));
  iVar5 = (int)CONCAT62(in_register_0000000a,config);
  if (iVar5 == 1) {
    if (height != 0) {
      uVar12 = 0;
      uVar7 = 0;
      do {
        TIFFReadScanline(tif,lVar3,uVar7);
        if (width != 0) {
          pfVar1 = (output_buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = 0;
          uVar9 = 0;
          uVar4 = uVar12;
          do {
            iVar5 = (int)uVar6;
            uVar10 = (ulong)spp;
            uVar11 = uVar4;
            if (spp != 0) {
              do {
                pfVar1[uVar11] = (float)*(int *)(lVar3 + uVar6 * 4) * 4.656613e-10;
                uVar11 = uVar11 + 1;
                uVar6 = (ulong)((int)uVar6 + 1);
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
            }
            uVar9 = uVar9 + 1;
            uVar4 = uVar4 + uVar8;
            uVar6 = (ulong)(iVar5 + uVar8);
          } while (uVar9 != width);
        }
        uVar7 = uVar7 + 1;
        uVar12 = uVar12 + width * uVar8;
      } while (uVar7 != height);
    }
  }
  else {
    if (iVar5 != 2) {
      _TIFFfree(lVar3);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid planar config");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (spp != 0) {
      local_4c = 0;
      do {
        if (height != 0) {
          uVar7 = 0;
          uVar12 = local_4c;
          do {
            TIFFReadScanline(tif,lVar3,uVar7,local_4c & 0xffff);
            if (width != 0) {
              pfVar1 = (output_buffer->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar6 = 0;
              uVar4 = uVar12;
              do {
                pfVar1[uVar4] = (float)*(int *)(lVar3 + uVar6 * 4) * 4.656613e-10;
                uVar6 = uVar6 + 1;
                uVar4 = uVar4 + uVar8;
              } while (width != uVar6);
            }
            uVar7 = uVar7 + 1;
            uVar12 = uVar12 + width * uVar8;
          } while (uVar7 != height);
        }
        local_4c = local_4c + 1;
      } while (local_4c != uVar8);
    }
  }
  _TIFFfree(lVar3);
  return;
}

Assistant:

void int_tif_to_float(
    uint32_t width, uint32_t height,
    uint16_t spp,
    uint16_t config,
    TIFF* tif,
    std::vector<float>& output_buffer)
{
    tdata_t buf;
    buf = _TIFFmalloc(TIFFScanlineSize(tif));

    output_buffer.resize(width * height * spp);

    switch (config) {
        case PLANARCONFIG_CONTIG:
            for (uint32_t y = 0; y < height; y++) {
                TIFFReadScanline(tif, buf, y, 0);
                T* scanline = (T*)buf;

                for (uint32_t x = 0; x < width; x++) {
                    for (uint16_t c = 0;  c < spp; c++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[spp * x + c] / (float)std::numeric_limits<T>::max();
                    }
                }
            }
            break;

        // TODO: This is untested code!
        case PLANARCONFIG_SEPARATE:
            for (uint16_t c = 0;  c < spp; c++) {
                for (uint32_t y = 0; y < height; y++) {
                    TIFFReadScanline(tif, buf, y, c);
                    T* scanline = (T*)buf;

                    for (uint32_t x = 0; x < width; x++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[x] / (float)std::numeric_limits<T>::max();
                    }
                }
            }
            break;

        default:
            _TIFFfree(buf);
            throw std::runtime_error("Invalid planar config");
    }

    _TIFFfree(buf);
}